

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printPredicateOperand(MCInst *MI,uint OpNo,SStream *O,char *Modifier)

{
  arm64_cc aVar1;
  MCOperand *op;
  ulong uVar2;
  arm64_cc aVar3;
  undefined4 in_register_00000034;
  char *s;
  
  op = MCInst_getOperand(MI,0);
  uVar2 = MCOperand_getImm(op);
  aVar1 = (arm64_cc)uVar2;
  aVar3 = aVar1;
  if ((int)aVar1 < 0x46) {
    switch(aVar1) {
    case ARM64_CC_PL:
    case ARM64_CC_VS:
      aVar3 = ARM64_CC_LO;
      break;
    case ARM64_CC_VC:
    case ARM64_CC_HI:
    case ARM64_CC_LS:
    case ARM64_CC_GE:
    case ARM64_CC_LT:
    case ARM64_CC_GT:
      break;
    case ARM64_CC_LE:
    case ARM64_CC_AL:
      aVar3 = ARM64_CC_LT;
      break;
    default:
      switch(aVar1) {
      case 0x26:
      case 0x27:
        aVar3 = 0x24;
        break;
      case 0x2e:
      case 0x2f:
        aVar3 = 0x2c;
      }
    }
  }
  else {
    switch(aVar1) {
    case 0x46:
    case 0x47:
      aVar3 = 0x44;
      break;
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
      break;
    case 0x4e:
    case 0x4f:
      aVar3 = 0x4c;
      break;
    default:
      switch(aVar1) {
      case 0x66:
      case 0x67:
        aVar3 = 100;
        break;
      case 0x6e:
      case 0x6f:
        aVar3 = 0x6c;
      }
    }
  }
  (MI->flat_insn->detail->field_6).arm64.cc = aVar3;
  if (O->buffer[0] != 'p') {
    if (((O->buffer[0] != 'c') || (O->buffer[1] != 'c')) || (O->buffer[2] != '\0'))
    goto LAB_0019d29b;
    if ((int)aVar1 < 0x4c) {
      if (aVar1 < 0x30) {
        if ((0xd0UL >> (uVar2 & 0x3f) & 1) != 0) {
          s = "ge";
          goto LAB_0019d3d8;
        }
        if ((0xd000000000U >> (uVar2 & 0x3f) & 1) != 0) {
          s = "le";
          goto LAB_0019d3d8;
        }
        if ((0xd00000000000U >> (uVar2 & 0x3f) & 1) != 0) {
          s = "gt";
          goto LAB_0019d3d8;
        }
      }
      if ((aVar1 - 0x46 < 2) || (aVar1 == 0x44)) {
        s = "ne";
        goto LAB_0019d3d8;
      }
    }
    else {
      uVar2 = (ulong)(aVar1 - 0x4c);
      if (aVar1 - 0x4c < 0x24) {
        if ((0xdUL >> (uVar2 & 0x3f) & 1) != 0) {
          s = "eq";
          goto LAB_0019d3d8;
        }
        if ((0xd000000UL >> (uVar2 & 0x3f) & 1) != 0) {
          s = "nu";
          goto LAB_0019d3d8;
        }
        if ((0xd00000000U >> (uVar2 & 0x3f) & 1) != 0) {
          s = "un";
          goto LAB_0019d3d8;
        }
      }
      if (aVar1 - 0x400 < 2) {
LAB_0019d3d1:
        s = "invalid-predicate";
        goto LAB_0019d3d8;
      }
    }
    s = "lt";
    goto LAB_0019d3d8;
  }
  if ((O->buffer[1] != 'm') || (O->buffer[2] != '\0')) {
LAB_0019d29b:
    printOperand(MI,1,(SStream *)CONCAT44(in_register_00000034,OpNo));
    return;
  }
  if ((int)aVar1 < 0x46) {
    switch(aVar1) {
    case ARM64_CC_PL:
    case ARM64_CC_LE:
      goto switchD_0019d2db_caseD_66;
    case ARM64_CC_VS:
    case ARM64_CC_AL:
      goto switchD_0019d2db_caseD_67;
    case ARM64_CC_VC:
    case ARM64_CC_HI:
    case ARM64_CC_LS:
    case ARM64_CC_GE:
    case ARM64_CC_LT:
    case ARM64_CC_GT:
      goto switchD_0019d2db_caseD_68;
    default:
      switch(aVar1) {
      case 0x26:
      case 0x2e:
        goto switchD_0019d2db_caseD_66;
      case 0x27:
      case 0x2f:
        goto switchD_0019d2db_caseD_67;
      default:
        goto switchD_0019d2db_caseD_68;
      }
    }
  }
  switch(aVar1) {
  case 0x46:
  case 0x4e:
switchD_0019d2db_caseD_66:
    s = "-";
    break;
  case 0x47:
  case 0x4f:
switchD_0019d2db_caseD_67:
    s = "+";
    break;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
switchD_0019d2db_caseD_68:
    return;
  default:
    switch(aVar1) {
    case 0x66:
    case 0x6e:
      goto switchD_0019d2db_caseD_66;
    case 0x67:
    case 0x6f:
      goto switchD_0019d2db_caseD_67;
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      goto switchD_0019d2db_caseD_68;
    default:
      if (1 < aVar1 - 0x400) {
        return;
      }
      goto LAB_0019d3d1;
    }
  }
LAB_0019d3d8:
  SStream_concat0((SStream *)CONCAT44(in_register_00000034,OpNo),s);
  return;
}

Assistant:

static void printPredicateOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	ARMCC_CondCodes CC = (ARMCC_CondCodes)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// Handle the undefined 15 CC value here for printing so we don't abort().
	if ((unsigned)CC == 15) {
		SStream_concat0(O, "<und>");
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.cc = ARM_CC_INVALID;
	} else {
		if (CC != ARMCC_AL) {
			SStream_concat0(O, ARMCC_ARMCondCodeToString(CC));
		}
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.cc = CC + 1;
	}
}